

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O2

string * __thiscall
AixLog::to_string_abi_cxx11_(string *__return_storage_ptr__,AixLog *this,Severity logSeverity)

{
  char *__s;
  stringstream ss;
  stringstream asStack_198 [16];
  undefined1 local_188 [376];
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    __s = "Trace";
    break;
  case 1:
    __s = "Debug";
    break;
  case 2:
    __s = "Info";
    break;
  case 3:
    __s = "Notice";
    break;
  case 4:
    __s = "Warn";
    break;
  case 5:
    __s = "Error";
    break;
  case 6:
    __s = "Fatal";
    break;
  default:
    std::__cxx11::stringstream::stringstream(asStack_198);
    std::ostream::operator<<(local_188,(int)(char)((ulong)this & 0xffffffff));
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(asStack_198);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)asStack_198);
  return __return_storage_ptr__;
}

Assistant:

static std::string to_string(Severity logSeverity) {
  switch (logSeverity) {
    case Severity::trace:
      return "Trace";
    case Severity::debug:
      return "Debug";
    case Severity::info:
      return "Info";
    case Severity::notice:
      return "Notice";
    case Severity::warning:
      return "Warn";
    case Severity::error:
      return "Error";
    case Severity::fatal:
      return "Fatal";
    default:
      std::stringstream ss;
      ss << static_cast<int>(logSeverity);
      return ss.str();
  }
}